

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall
Json::Reader::decodeUnicodeEscapeSequence
          (Reader *this,Token *token,Location *current,Location end,uint *ret_unicode)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  allocator<char> local_39;
  String local_38;
  
  if ((long)end - (long)*current < 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Bad unicode escape sequence in string: four digits expected.",
               &local_39);
    addError(this,&local_38,token,*current);
LAB_00472d95:
    std::__cxx11::string::~string((string *)&local_38);
    bVar8 = false;
  }
  else {
    uVar5 = 0;
    iVar6 = 4;
    pcVar2 = *current;
    while( true ) {
      pcVar3 = pcVar2 + 1;
      bVar8 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar8) break;
      *current = pcVar3;
      cVar1 = *pcVar2;
      iVar7 = (int)cVar1;
      iVar4 = uVar5 * 0x10;
      pcVar2 = pcVar3;
      if ((byte)(cVar1 - 0x30U) < 10) {
        uVar5 = (iVar4 + iVar7) - 0x30;
      }
      else if ((byte)(cVar1 + 0x9fU) < 6) {
        uVar5 = (iVar4 + iVar7) - 0x57;
      }
      else {
        if (5 < (byte)(cVar1 + 0xbfU)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,
                     "Bad unicode escape sequence in string: hexadecimal digit expected.",&local_39)
          ;
          addError(this,&local_38,token,*current);
          goto LAB_00472d95;
        }
        uVar5 = (iVar4 + iVar7) - 0x37;
      }
    }
    *ret_unicode = uVar5;
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool Reader::decodeUnicodeEscapeSequence(Token& token, Location& current,
                                         Location end,
                                         unsigned int& ret_unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.", token,
        current);
  int unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token, current);
  }
  ret_unicode = static_cast<unsigned int>(unicode);
  return true;
}